

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::SingleArena_ConstructEmptyWithDefault_Test::TestBody
          (SingleArena_ConstructEmptyWithDefault_Test *this)

{
  _func_int *message;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  ArenaStringPtr field;
  AssertHelper AStack_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  undefined1 local_28 [8];
  internal local_20 [8];
  WithParamInterface<bool> local_18;
  ArenaStringPtr local_10;
  
  SingleArena::GetArena((SingleArena *)local_28);
  local_10.tagged_ptr_.ptr_ = (TaggedStringPtr)&protobuf::internal::fixed_address_empty_string;
  message = (_func_int *)(anon_var_dwarf_a22956 + 5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
            (local_20,"field.Get()","\"\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &protobuf::internal::fixed_address_empty_string,
             (char (*) [1])(anon_var_dwarf_a22956 + 5));
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_18._vptr_WithParamInterface !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = *local_18._vptr_WithParamInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x7d,(char *)message);
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_18._vptr_WithParamInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_18._vptr_WithParamInterface);
  }
  if (local_28 == (undefined1  [8])0x0) {
    protobuf::internal::ArenaStringPtr::Destroy(&local_10);
  }
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              local_28);
  return;
}

Assistant:

TEST_P(SingleArena, ConstructEmptyWithDefault) {
  auto arena = GetArena();
  internal::LazyString default_value{{{"Hello default", 13}}, {nullptr}};
  ArenaStringPtr field(arena.get(), default_value);

  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_EQ(field.Get(), "Hello default");
    EXPECT_FALSE(field.IsDefault());
  } else {
    EXPECT_EQ(field.Get(), "");
    EXPECT_TRUE(field.IsDefault());
  }
  if (arena == nullptr) field.Destroy();
}